

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O2

void bb_color(long param_1,long param_2)

{
  ulong uVar1;
  iterator __position;
  long lVar2;
  int iVar3;
  iterator it;
  int iVar4;
  list<int,_std::allocator<int>_> lv;
  Vset cur;
  _List_base<int,_std::allocator<int>_> local_7a0;
  _Base_bitset<235UL> local_788;
  
  local_7a0._M_impl._M_node._M_size = 0;
  uVar1 = 0;
  local_7a0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_7a0;
  local_7a0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_7a0;
  while( true ) {
    local_788._M_w[0]._0_4_ = (int)uVar1;
    if (size <= (int)local_788._M_w[0]) break;
    if (((((bitset<15000UL> *)&stack0x00000008)->super__Base_bitset<235UL>)._M_w
         [(ulong)(long)(int)local_788._M_w[0] >> 6] >> (uVar1 & 0x3f) & 1) != 0) {
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)&local_7a0,(value_type *)&local_788);
    }
    uVar1 = (ulong)((int)local_788._M_w[0] + 1);
  }
  iVar3 = 0;
  iVar4 = 0;
  while (__position._M_node = local_7a0._M_impl._M_node.super__List_node_base._M_next,
        local_7a0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_7a0) {
    memcpy(&local_788,(bitset<15000UL> *)&stack0x00000008,0x758);
    iVar4 = iVar4 + 1;
    while (__position._M_node != (_List_node_base *)&local_7a0) {
      uVar1 = (ulong)*(int *)&__position._M_node[1]._M_next;
      if ((local_788._M_w[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
        __position._M_node = (__position._M_node)->_M_next;
      }
      else {
        std::_Base_bitset<235UL>::_M_do_and(&local_788,&NC[uVar1].super__Base_bitset<235UL>);
        std::bitset<15000UL>::reset
                  ((bitset<15000UL> *)&stack0x00000008,(long)*(int *)&__position._M_node[1]._M_next)
        ;
        lVar2 = (long)iVar3;
        *(undefined4 *)(param_1 + lVar2 * 4) = *(undefined4 *)&__position._M_node[1]._M_next;
        iVar3 = iVar3 + 1;
        *(int *)(param_2 + lVar2 * 4) = iVar4;
        __position = std::__cxx11::list<int,_std::allocator<int>_>::erase
                               ((list<int,_std::allocator<int>_> *)&local_7a0,__position._M_node);
      }
    }
  }
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear(&local_7a0);
  return;
}

Assistant:

void bb_color(Vset C, int *U, int *color) {
    int cnt_color = 0, pt = 0;
    list<int> lv;
    for (int v = 0; v < size; ++v)
        if (C[v]) lv.push_back(v);

    while(!lv.empty()) {
        Vset cur = C;
        ++cnt_color;
        for (list<int>::iterator it = lv.begin(); it != lv.end(); ) {
            if (cur[*it]) {
                cur &= NC[*it];
                C.reset(*it);
                U[pt] = *it;
                color[pt++] = cnt_color;
                it = lv.erase(it);
            } else ++it;
        }
    }
}